

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCec.c
# Opt level: O0

int Fra_FraigCecTop(Aig_Man_t *pMan1,Aig_Man_t *pMan2,int nConfLimit,int nPartSize,int fSmart,
                   int fVerbose)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  abctime aVar4;
  abctime clkTotal;
  int RetValue;
  Aig_Man_t *pTemp;
  int fVerbose_local;
  int fSmart_local;
  int nPartSize_local;
  int nConfLimit_local;
  Aig_Man_t *pMan2_local;
  Aig_Man_t *pMan1_local;
  
  aVar3 = Abc_Clock();
  iVar1 = Aig_ManCiNum(pMan1);
  iVar2 = Aig_ManCiNum(pMan1);
  if (iVar1 == iVar2) {
    iVar1 = Aig_ManCoNum(pMan1);
    iVar2 = Aig_ManCoNum(pMan1);
    if (iVar1 == iVar2) {
      iVar1 = Aig_ManCiNum(pMan1);
      iVar2 = Aig_ManCiNum(pMan1);
      if (iVar1 != iVar2) {
        __assert_fail("Aig_ManCiNum(pMan1) == Aig_ManCiNum(pMan1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraCec.c"
                      ,0x212,"int Fra_FraigCecTop(Aig_Man_t *, Aig_Man_t *, int, int, int, int)");
      }
      iVar1 = Aig_ManCoNum(pMan1);
      iVar2 = Aig_ManCoNum(pMan1);
      if (iVar1 != iVar2) {
        __assert_fail("Aig_ManCoNum(pMan1) == Aig_ManCoNum(pMan1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraCec.c"
                      ,0x213,"int Fra_FraigCecTop(Aig_Man_t *, Aig_Man_t *, int, int, int, int)");
      }
      iVar1 = Aig_ManNodeNum(pMan1);
      iVar2 = Aig_ManNodeNum(pMan2);
      _nPartSize_local = pMan2;
      pMan2_local = pMan1;
      if (iVar1 < iVar2) {
        _nPartSize_local = pMan1;
        pMan2_local = pMan2;
      }
      iVar1 = Aig_ManNodeNum(pMan2_local);
      iVar2 = Aig_ManNodeNum(_nPartSize_local);
      if (iVar1 < iVar2) {
        __assert_fail("Aig_ManNodeNum(pMan1) >= Aig_ManNodeNum(pMan2)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraCec.c"
                      ,0x21c,"int Fra_FraigCecTop(Aig_Man_t *, Aig_Man_t *, int, int, int, int)");
      }
      if (nPartSize == 0) {
        iVar1 = Aig_ManCoNum(pMan2_local);
        clkTotal._4_4_ =
             Fra_FraigCecPartitioned(pMan2_local,_nPartSize_local,nConfLimit,iVar1,0,fVerbose);
      }
      else {
        clkTotal._4_4_ =
             Fra_FraigCecPartitioned
                       (pMan2_local,_nPartSize_local,nConfLimit,nPartSize,fSmart,fVerbose);
      }
      if (clkTotal._4_4_ == 1) {
        printf("Networks are equivalent.   ");
        Abc_Print(1,"%s =","Time");
        aVar4 = Abc_Clock();
        Abc_Print(1,"%9.2f sec\n",((double)(aVar4 - aVar3) * 1.0) / 1000000.0);
      }
      else if (clkTotal._4_4_ == 0) {
        printf("Networks are NOT EQUIVALENT.   ");
        Abc_Print(1,"%s =","Time");
        aVar4 = Abc_Clock();
        Abc_Print(1,"%9.2f sec\n",((double)(aVar4 - aVar3) * 1.0) / 1000000.0);
      }
      else {
        printf("Networks are UNDECIDED.   ");
        Abc_Print(1,"%s =","Time");
        aVar4 = Abc_Clock();
        Abc_Print(1,"%9.2f sec\n",((double)(aVar4 - aVar3) * 1.0) / 1000000.0);
      }
      fflush(_stdout);
      pMan1_local._4_4_ = clkTotal._4_4_;
    }
    else {
      printf("Abc_CommandAbc8Cec(): Miters have different number of POs.\n");
      pMan1_local._4_4_ = 0;
    }
  }
  else {
    printf("Abc_CommandAbc8Cec(): Miters have different number of PIs.\n");
    pMan1_local._4_4_ = 0;
  }
  return pMan1_local._4_4_;
}

Assistant:

int Fra_FraigCecTop( Aig_Man_t * pMan1, Aig_Man_t * pMan2, int nConfLimit, int nPartSize, int fSmart, int fVerbose )
{
    Aig_Man_t * pTemp;
    //Abc_NtkDarCec( pNtk1, pNtk2, fPartition, fVerbose );
    int RetValue;
    abctime clkTotal = Abc_Clock();

    if ( Aig_ManCiNum(pMan1) != Aig_ManCiNum(pMan1) )
    {
        printf( "Abc_CommandAbc8Cec(): Miters have different number of PIs.\n" );
        return 0;
    }
    if ( Aig_ManCoNum(pMan1) != Aig_ManCoNum(pMan1) )
    {
        printf( "Abc_CommandAbc8Cec(): Miters have different number of POs.\n" );
        return 0;
    }
    assert( Aig_ManCiNum(pMan1) == Aig_ManCiNum(pMan1) );
    assert( Aig_ManCoNum(pMan1) == Aig_ManCoNum(pMan1) );

    // make sure that the first miter has more nodes
    if ( Aig_ManNodeNum(pMan1) < Aig_ManNodeNum(pMan2) )
    {
        pTemp = pMan1;
        pMan1 = pMan2;
        pMan2 = pTemp;
    }
    assert( Aig_ManNodeNum(pMan1) >= Aig_ManNodeNum(pMan2) );

    if ( nPartSize )
        RetValue = Fra_FraigCecPartitioned( pMan1, pMan2, nConfLimit, nPartSize, fSmart, fVerbose );
    else // no partitioning
        RetValue = Fra_FraigCecPartitioned( pMan1, pMan2, nConfLimit, Aig_ManCoNum(pMan1), 0, fVerbose );

    // report the miter
    if ( RetValue == 1 )
    {
        printf( "Networks are equivalent.   " );
ABC_PRT( "Time", Abc_Clock() - clkTotal );
    }
    else if ( RetValue == 0 )
    {
        printf( "Networks are NOT EQUIVALENT.   " );
ABC_PRT( "Time", Abc_Clock() - clkTotal );
    }
    else
    {
        printf( "Networks are UNDECIDED.   " );
ABC_PRT( "Time", Abc_Clock() - clkTotal );
    }
    fflush( stdout );
    return RetValue;
}